

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O3

void indexed12_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  uint8_t *puVar1;
  cs_m680x_op *op;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  
  bVar6 = (info->m680x).op_count;
  (info->m680x).op_count = bVar6 + 1;
  op = (info->m680x).operands + bVar6;
  uVar3 = *address;
  *address = uVar3 + 1;
  lVar5 = (ulong)uVar3 - (ulong)info->offset;
  if ((uint)lVar5 < info->size) {
    bVar6 = info->code[lVar5];
  }
  else {
    bVar6 = 0;
  }
  op->type = M680X_OP_INDEXED;
  set_operand_size(info,op,(uint8_t)address);
  (op->field_1).idx.offset_reg = M680X_REG_INVALID;
  if ((bVar6 & 0x20) == 0) {
    (op->field_1).imm = g_idx12_to_reg_ids[bVar6 >> 6];
    uVar3 = bVar6 | 0xfff0;
    if ((bVar6 & 0x10) == 0) {
      uVar3 = bVar6 & 0xf;
    }
    (op->field_1).idx.offset = uVar3;
    (op->field_1).idx.offset_addr = uVar3 + *address;
    (op->field_1).idx.offset_bits = '\x05';
  }
  else {
    uVar4 = (uint)bVar6;
    if ((~uVar4 & 0xe0) == 0) {
      (op->field_1).imm = *(int32_t *)((long)g_idx12_to_reg_ids + (ulong)(bVar6 >> 1 & 0xc));
    }
    switch(uVar4 & 0xffffffe7) {
    case 0xe0:
    case 0xe1:
      uVar3 = *address;
      *address = uVar3 + 1;
      lVar5 = (ulong)uVar3 - (ulong)info->offset;
      if ((uint)lVar5 < info->size) {
        uVar3 = (ushort)info->code[lVar5];
      }
      else {
        uVar3 = 0;
      }
      if ((bVar6 & 1) != 0) {
        uVar3 = uVar3 - 0x100;
      }
      (op->field_1).idx.offset = uVar3;
      (op->field_1).idx.offset_bits = '\t';
      if ((op->field_1).imm == 0x13) {
        (op->field_1).idx.offset_addr = uVar3 + *address;
      }
      break;
    case 0xe3:
      puVar1 = &(op->field_1).idx.flags;
      *puVar1 = *puVar1 | 1;
    case 0xe2:
      read_word(info,(uint16_t *)&(op->field_1).idx.offset,*address);
      *address = *address + 2;
      (op->field_1).idx.offset_bits = '\x10';
      if ((op->field_1).imm == 0x13) {
        (op->field_1).idx.offset_addr = *address + (op->field_1).idx.offset;
      }
      break;
    case 0xe4:
    case 0xe5:
    case 0xe6:
      (op->field_1).idx.offset_reg = g_or12_to_reg_ids[uVar4 & 3];
      break;
    case 0xe7:
      (op->field_1).idx.offset_reg = M680X_REG_D;
      puVar1 = &(op->field_1).idx.flags;
      *puVar1 = *puVar1 | 1;
      break;
    default:
      (op->field_1).imm = g_idx12_to_reg_ids[bVar6 >> 6];
      bVar2 = bVar6 & 0xf;
      (op->field_1).idx.inc_dec = ((bVar2 < 8) << 4 | bVar2) + (bVar2 < 8) + -0x10;
      if ((bVar6 & 0x10) != 0) {
        puVar1 = &(op->field_1).idx.flags;
        *puVar1 = *puVar1 | 4;
      }
    }
  }
  return;
}

Assistant:

static void indexed12_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op = &m680x->operands[m680x->op_count++];
	uint8_t post_byte = 0;
	uint8_t offset8 = 0;

	read_byte(info, &post_byte, (*address)++);

	op->type = M680X_OP_INDEXED;
	set_operand_size(info, op, 1);
	op->idx.offset_reg = M680X_REG_INVALID;

	if (!(post_byte & 0x20)) {
		// n5,R      n5 is a 5-bit signed offset
		op->idx.base_reg = g_idx12_to_reg_ids[(post_byte >> 6) & 0x03];

		if ((post_byte & 0x10) == 0x10)
			op->idx.offset = post_byte | 0xfff0;
		else
			op->idx.offset = post_byte & 0x0f;

		op->idx.offset_addr = op->idx.offset + *address;
		op->idx.offset_bits = M680X_OFFSET_BITS_5;
	}
	else {
		if ((post_byte & 0xe0) == 0xe0)
			op->idx.base_reg =
				g_idx12_to_reg_ids[(post_byte >> 3) & 0x03];

		switch (post_byte & 0xe7) {
		case 0xe0:
		case 0xe1: // n9,R
			read_byte(info, &offset8, (*address)++);
			op->idx.offset = offset8;

			if (post_byte & 0x01) // sign extension
				op->idx.offset |= 0xff00;

			op->idx.offset_bits = M680X_OFFSET_BITS_9;

			if (op->idx.base_reg == M680X_REG_PC)
				op->idx.offset_addr = op->idx.offset + *address;

			break;

		case 0xe3: // [n16,R]
			op->idx.flags |= M680X_IDX_INDIRECT;

		// intentionally fall through
		case 0xe2: // n16,R
			read_word(info, (uint16_t *)&op->idx.offset, *address);
			(*address) += 2;
			op->idx.offset_bits = M680X_OFFSET_BITS_16;

			if (op->idx.base_reg == M680X_REG_PC)
				op->idx.offset_addr = op->idx.offset + *address;

			break;

		case 0xe4: // A,R
		case 0xe5: // B,R
		case 0xe6: // D,R
			op->idx.offset_reg =
				g_or12_to_reg_ids[post_byte & 0x03];
			break;

		case 0xe7: // [D,R]
			op->idx.offset_reg = M680X_REG_D;
			op->idx.flags |= M680X_IDX_INDIRECT;
			break;

		default: // n,-r n,+r n,r- n,r+
			// PC is not allowed in this mode
			op->idx.base_reg =
				g_idx12_to_reg_ids[(post_byte >> 6) & 0x03];
			op->idx.inc_dec = post_byte & 0x0f;

			if (op->idx.inc_dec & 0x08) // evtl. sign extend value
				op->idx.inc_dec |= 0xf0;

			if (op->idx.inc_dec >= 0)
				op->idx.inc_dec++;

			if (post_byte & 0x10)
				op->idx.flags |= M680X_IDX_POST_INC_DEC;

			break;

		}
	}
}